

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

UDate __thiscall
icu_63::CalendarAstronomer::timeOfAngle
          (CalendarAstronomer *this,AngleFunc *func,double desired,double periodDays,double epsilon,
          UBool next)

{
  double extraout_XMM0_Qa;
  double dVar1;
  double dVar2;
  double extraout_XMM0_Qa_00;
  double dVar3;
  double dVar4;
  UDate UVar5;
  double local_c8;
  double local_88;
  double delta;
  double factor;
  double angle;
  UDate startTime;
  double lastDeltaT;
  double deltaT;
  double deltaAngle;
  double lastAngle;
  UBool next_local;
  double epsilon_local;
  double periodDays_local;
  double desired_local;
  AngleFunc *func_local;
  CalendarAstronomer *this_local;
  
  (**func->_vptr_AngleFunc)();
  dVar1 = norm2PI(desired - extraout_XMM0_Qa);
  local_88 = 0.0;
  if (next == '\0') {
    local_88 = -6.283185307179586;
  }
  lastDeltaT = ((dVar1 + local_88) * periodDays * 86400000.0) / 6.283185307179586;
  dVar1 = this->fTime;
  dVar3 = this->fTime;
  dVar2 = uprv_ceil_63(lastDeltaT);
  setTime(this,dVar3 + dVar2);
  deltaAngle = extraout_XMM0_Qa;
  do {
    (**func->_vptr_AngleFunc)(func,this);
    dVar3 = normPI(extraout_XMM0_Qa_00 - deltaAngle);
    dVar3 = uprv_fabs_63(lastDeltaT / dVar3);
    dVar2 = normPI(desired - extraout_XMM0_Qa_00);
    dVar2 = dVar2 * dVar3;
    dVar3 = uprv_fabs_63(dVar2);
    dVar4 = uprv_fabs_63(lastDeltaT);
    if (dVar4 < dVar3) {
      local_c8 = uprv_ceil_63((periodDays * 86400000.0) / 8.0);
      if (next == '\0') {
        local_c8 = -local_c8;
      }
      setTime(this,dVar1 + local_c8);
      UVar5 = timeOfAngle(this,func,desired,periodDays,epsilon,next);
      return UVar5;
    }
    dVar3 = this->fTime;
    dVar4 = uprv_ceil_63(dVar2);
    setTime(this,dVar3 + dVar4);
    dVar3 = uprv_fabs_63(dVar2);
    lastDeltaT = dVar2;
    deltaAngle = extraout_XMM0_Qa_00;
  } while (epsilon < dVar3);
  return this->fTime;
}

Assistant:

UDate CalendarAstronomer::timeOfAngle(AngleFunc& func, double desired,
                                      double periodDays, double epsilon, UBool next)
{
    // Find the value of the function at the current time
    double lastAngle = func.eval(*this);

    // Find out how far we are from the desired angle
    double deltaAngle = norm2PI(desired - lastAngle) ;

    // Using the average period, estimate the next (or previous) time at
    // which the desired angle occurs.
    double deltaT =  (deltaAngle + (next ? 0.0 : - CalendarAstronomer_PI2 )) * (periodDays*DAY_MS) / CalendarAstronomer_PI2;

    double lastDeltaT = deltaT; // Liu
    UDate startTime = fTime; // Liu

    setTime(fTime + uprv_ceil(deltaT));

    // Now iterate until we get the error below epsilon.  Throughout
    // this loop we use normPI to get values in the range -Pi to Pi,
    // since we're using them as correction factors rather than absolute angles.
    do {
        // Evaluate the function at the time we've estimated
        double angle = func.eval(*this);

        // Find the # of milliseconds per radian at this point on the curve
        double factor = uprv_fabs(deltaT / normPI(angle-lastAngle));

        // Correct the time estimate based on how far off the angle is
        deltaT = normPI(desired - angle) * factor;

        // HACK:
        //
        // If abs(deltaT) begins to diverge we need to quit this loop.
        // This only appears to happen when attempting to locate, for
        // example, a new moon on the day of the new moon.  E.g.:
        //
        // This result is correct:
        // newMoon(7508(Mon Jul 23 00:00:00 CST 1990,false))=
        //   Sun Jul 22 10:57:41 CST 1990
        //
        // But attempting to make the same call a day earlier causes deltaT
        // to diverge:
        // CalendarAstronomer.timeOfAngle() diverging: 1.348508727575625E9 ->
        //   1.3649828540224032E9
        // newMoon(7507(Sun Jul 22 00:00:00 CST 1990,false))=
        //   Sun Jul 08 13:56:15 CST 1990
        //
        // As a temporary solution, we catch this specific condition and
        // adjust our start time by one eighth period days (either forward
        // or backward) and try again.
        // Liu 11/9/00
        if (uprv_fabs(deltaT) > uprv_fabs(lastDeltaT)) {
            double delta = uprv_ceil (periodDays * DAY_MS / 8.0);
            setTime(startTime + (next ? delta : -delta));
            return timeOfAngle(func, desired, periodDays, epsilon, next);
        }

        lastDeltaT = deltaT;
        lastAngle = angle;

        setTime(fTime + uprv_ceil(deltaT));
    }
    while (uprv_fabs(deltaT) > epsilon);

    return fTime;
}